

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall
XPMP2::SocketNetworking::Open
          (SocketNetworking *this,string *_addr,int _port,size_t _bufSize,uint _timeOut_ms,
          bool _bBroadcast)

{
  int iVar1;
  ulong uVar2;
  SocketNetworking *this_00;
  char *pcVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined4 in_EDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint in_R8D;
  byte in_R9B;
  timeval timeout;
  int setToVal;
  int r;
  addrinfo hints;
  string decimal_port;
  addrinfo *addrinfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  size_t in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  undefined4 uVar6;
  string *in_stack_fffffffffffffbd8;
  NetRuntimeError *in_stack_fffffffffffffbe0;
  ulong local_2d0;
  ulong local_2c8;
  undefined1 local_2b9;
  undefined1 local_231;
  undefined4 local_1b0;
  undefined1 local_1a9;
  undefined1 local_121;
  int local_9c;
  addrinfo local_98;
  string local_60 [48];
  addrinfo *local_30;
  byte local_25;
  uint local_24;
  
  local_25 = in_R9B & 1;
  local_30 = (addrinfo *)0x0;
  *(undefined4 *)((long)&in_RDI->_M_string_length + 4) = in_EDX;
  local_24 = in_R8D;
  std::__cxx11::string::operator=((string *)(in_RDI->field_2)._M_local_buf,in_RSI);
  std::__cxx11::to_string(in_stack_fffffffffffffb9c);
  local_98.ai_canonname = (char *)0x0;
  local_98.ai_next = (addrinfo *)0x0;
  local_98.ai_addrlen = 0;
  local_98._20_4_ = 0;
  local_98.ai_addr = (sockaddr *)0x0;
  local_98.ai_flags = 0;
  local_98.ai_family = 0;
  local_98.ai_socktype = 0;
  local_98.ai_protocol = 0;
  (**(code **)(*(long *)in_RDI + 0x30))(in_RDI,&local_98);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    pcVar3 = "0.0.0.0";
    if (local_98.ai_family == 10) {
      pcVar3 = "::";
    }
    std::__cxx11::string::operator=((string *)(in_RDI->field_2)._M_local_buf,pcVar3);
  }
  this_00 = (SocketNetworking *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_9c = getaddrinfo((char *)this_00,pcVar3,&local_98,&local_30);
  if ((local_9c != 0) || (local_30 == (addrinfo *)0x0)) {
    local_121 = 1;
    uVar4 = __cxa_allocate_exception(0x50);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),in_RDI);
    std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
    NetRuntimeError::NetRuntimeError(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    local_121 = 0;
    __cxa_throw(uVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  iVar1 = socket(local_30->ai_family,local_30->ai_socktype,local_30->ai_protocol);
  *(int *)&in_RDI->_M_string_length = iVar1;
  if ((int)in_RDI->_M_string_length == -1) {
    local_1a9 = 1;
    uVar4 = __cxa_allocate_exception(0x50);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),in_RDI);
    std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
    NetRuntimeError::NetRuntimeError(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    local_1a9 = 0;
    __cxa_throw(uVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  local_1b0 = 1;
  iVar1 = setsockopt((int)in_RDI->_M_string_length,1,2,&local_1b0,4);
  if (iVar1 < 0) {
    local_231 = 1;
    uVar4 = __cxa_allocate_exception(0x50);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),in_RDI);
    std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
    NetRuntimeError::NetRuntimeError(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    local_231 = 0;
    __cxa_throw(uVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  iVar1 = setsockopt((int)in_RDI->_M_string_length,1,0xf,&local_1b0,4);
  if (iVar1 < 0) {
    local_2b9 = 1;
    uVar4 = __cxa_allocate_exception(0x50);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),in_RDI);
    std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
    NetRuntimeError::NetRuntimeError(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    local_2b9 = 0;
    __cxa_throw(uVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  local_2d0 = (ulong)local_24 / 1000;
  local_2c8 = (ulong)((local_24 % 1000) * 1000);
  iVar1 = setsockopt((int)in_RDI->_M_string_length,1,0x14,&local_2d0,0x10);
  if (iVar1 < 0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x50);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),in_RDI);
    std::operator+(pbVar5,(char *)in_stack_fffffffffffffb50);
    std::operator+(pbVar5,in_stack_fffffffffffffb50);
    std::operator+(pbVar5,(char *)in_stack_fffffffffffffb50);
    NetRuntimeError::NetRuntimeError(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    __cxa_throw(pbVar5,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  if ((local_25 & 1) != 0) {
    local_1b0 = 1;
    iVar1 = setsockopt((int)in_RDI->_M_string_length,1,6,&local_1b0,4);
    if (iVar1 < 0) {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x50);
      std::operator+((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),in_RDI);
      std::operator+(in_stack_fffffffffffffb58,(char *)pbVar5);
      std::operator+(in_stack_fffffffffffffb58,pbVar5);
      std::operator+(in_stack_fffffffffffffb58,(char *)pbVar5);
      NetRuntimeError::NetRuntimeError(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      __cxa_throw(pbVar5,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
    }
  }
  local_9c = bind((int)in_RDI->_M_string_length,local_30->ai_addr,local_30->ai_addrlen);
  if (local_9c == 0) {
    freeaddrinfo(local_30);
    local_30 = (addrinfo *)0x0;
    SetBufSize(this_00,in_stack_fffffffffffffb78);
    std::__cxx11::string::~string(local_60);
    return;
  }
  uVar6 = CONCAT13(1,(int3)in_stack_fffffffffffffb9c);
  uVar4 = __cxa_allocate_exception(0x50);
  std::operator+((char *)CONCAT44(uVar6,in_stack_fffffffffffffb98),in_RDI);
  std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
  std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
  std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
  NetRuntimeError::NetRuntimeError(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  __cxa_throw(uVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
}

Assistant:

void SocketNetworking::Open(const std::string& _addr, int _port,
                       size_t _bufSize, unsigned _timeOut_ms, bool _bBroadcast)
{
    struct addrinfo *   addrinfo      = NULL;
    try {
        // store member values
        f_port = _port;
        f_addr = _addr;
        const std::string decimal_port(std::to_string(f_port));

        // get a valid address based on inAddr/port
        struct addrinfo hints;
        memset(&hints, 0, sizeof(hints));
        GetAddrHints(hints);            // ask subclasses
        
        // Any address?
        if (f_addr.empty())
            f_addr = hints.ai_family == AF_INET6 ? "::" : "0.0.0.0";
        
        // Need to get
        int r = getaddrinfo(f_addr.c_str(),
                            decimal_port.c_str(), &hints, &addrinfo);
        if(r != 0 || addrinfo == NULL)
            throw NetRuntimeError("invalid address or port for socket: \"" + f_addr + ":" + decimal_port + "\"");
        
        // get a socket
        f_socket = socket(addrinfo->ai_family, addrinfo->ai_socktype, addrinfo->ai_protocol);
        if(f_socket == INVALID_SOCKET)
            throw NetRuntimeError("could not create socket for: \"" + f_addr + ":" + decimal_port + "\"");
        
        // Reuse address and port to allow others to connect, too
        int setToVal = 1;
#if IBM
        if (setsockopt(f_socket, SOL_SOCKET, SO_REUSEADDR, (char*)&setToVal, sizeof(setToVal)) < 0)
            throw NetRuntimeError("could not setsockopt SO_REUSEADDR for: \"" + f_addr + ":" + decimal_port + "\"");
#else
        if (setsockopt(f_socket, SOL_SOCKET, SO_REUSEADDR, &setToVal, sizeof(setToVal)) < 0)
            throw NetRuntimeError("could not setsockopt SO_REUSEADDR for: \"" + f_addr + ":" + decimal_port + "\"");
        if (setsockopt(f_socket, SOL_SOCKET, SO_REUSEPORT, &setToVal, sizeof(setToVal)) < 0)
            throw NetRuntimeError("could not setsockopt SO_REUSEPORT for: \"" + f_addr + ":" + decimal_port + "\"");
#endif

        // define receive timeout
#if IBM
        DWORD wsTimeout = _timeOut_ms;
        if (setsockopt(f_socket, SOL_SOCKET, SO_RCVTIMEO, (char*)&wsTimeout, sizeof(wsTimeout)) < 0)
            throw NetRuntimeError("could not setsockopt SO_RCVTIMEO for: \"" + f_addr + ":" + decimal_port + "\"");
#else
        struct timeval timeout;
        timeout.tv_sec = _timeOut_ms / 1000;
        timeout.tv_usec = (_timeOut_ms % 1000) * 1000;
        if (setsockopt(f_socket, SOL_SOCKET, SO_RCVTIMEO, &timeout, sizeof(timeout)) < 0)
            throw NetRuntimeError("could not setsockopt SO_RCVTIMEO for: \"" + f_addr + ":" + decimal_port + "\"");
#endif
        
        // if requested allow for sending broadcasts
        if (_bBroadcast) {
            setToVal = 1;
#if IBM
            if (setsockopt(f_socket, SOL_SOCKET, SO_BROADCAST, (char*)&setToVal, sizeof(setToVal)) < 0)
                throw NetRuntimeError("could not setsockopt SO_BROADCAST for: \"" + f_addr + ":" + decimal_port + "\"");
#else
            if (setsockopt(f_socket, SOL_SOCKET, SO_BROADCAST, &setToVal, sizeof(setToVal)) < 0)
                throw NetRuntimeError("could not setsockopt SO_BROADCAST for: \"" + f_addr + ":" + decimal_port + "\"");
#endif
        }

        // bind the socket to the address:port
        r = bind(f_socket, addrinfo->ai_addr, (socklen_t)addrinfo->ai_addrlen);
        if(r != 0)
            throw NetRuntimeError("could not bind UDP socket with: \"" + f_addr + ":" + decimal_port + "\"");

        // free adress info
        freeaddrinfo(addrinfo);
        addrinfo = NULL;

        // reserve receive buffer
        SetBufSize(_bufSize);
    }
    catch (...) {
        // free adress info
        if (addrinfo) {
            freeaddrinfo(addrinfo);
            addrinfo = NULL;
        }
        // make sure everything is closed
        Close();
        // re-throw
        throw;
    }
}